

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  ulong uVar1;
  _union_1457 _Var2;
  InternalRunDeathTestFlag *pIVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  int *piVar8;
  void *__addr;
  size_type *psVar9;
  __sighandler_t p_Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong *puVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar15;
  undefined8 uVar16;
  size_t __len;
  int pipe_fd [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  int death_test_index;
  ExecDeathTestArgs args_2;
  string internal_flag;
  string filter_flag;
  sigaction saved_sigprof_action;
  sigaction ignore_sigprof_action;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  string local_238;
  string local_218;
  int local_1f8;
  int local_1f4;
  pointer local_1f0;
  string local_1e8;
  int local_1c8 [2];
  string local_1c0;
  value_type local_1a0;
  value_type local_180;
  _union_1457 local_160;
  long local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150 [8];
  _union_1457 local_c8;
  sigset_t local_c0;
  
  UnitTest::GetInstance();
  pIVar3 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_1c8[0] = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
                 death_test_count_;
  if (pIVar3 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar3->write_fd_;
    return EXECUTE_TEST;
  }
  iVar4 = pipe(&local_1f8);
  if (iVar4 == -1) {
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"CHECK failed: File ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_298._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_298._M_dataplus._M_p == psVar9) {
      local_298.field_2._M_allocated_capacity = *psVar9;
      local_298.field_2._8_8_ = plVar6[3];
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    }
    else {
      local_298.field_2._M_allocated_capacity = *psVar9;
    }
    local_298._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_2f8._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2f8._M_dataplus._M_p == psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar6[3];
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
    }
    local_2f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_258._M_dataplus._M_p._0_4_ = 0x550;
    StreamableToString<int>(&local_278,(int *)&local_258);
    std::operator+(&local_2d8,&local_2f8,&local_278);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    local_c8.sa_handler = (__sighandler_t)*plVar6;
    p_Var10 = (__sighandler_t)(plVar6 + 2);
    if (local_c8.sa_handler == p_Var10) {
      local_c0.__val[1] = *(ulong *)p_Var10;
      local_c0.__val[2] = plVar6[3];
      local_c8.sa_handler = (__sighandler_t)(local_c0.__val + 1);
    }
    else {
      local_c0.__val[1] = *(ulong *)p_Var10;
    }
    local_c0.__val[0] = plVar6[1];
    *plVar6 = (long)p_Var10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_160.sa_handler = (__sighandler_t)*plVar6;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.sa_handler == paVar14) {
      local_150[0]._0_8_ = paVar14->_M_allocated_capacity;
      local_150[0]._8_8_ = plVar6[3];
      local_160.sa_handler = (__sighandler_t)local_150;
    }
    else {
      local_150[0]._0_8_ = paVar14->_M_allocated_capacity;
    }
    local_158 = plVar6[1];
    *plVar6 = (long)paVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    DeathTestAbort((string *)&local_160);
  }
  iVar4 = fcntl(local_1f4,2,0);
  if (iVar4 == -1) {
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"CHECK failed: File ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_298._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_298._M_dataplus._M_p == psVar9) {
      local_298.field_2._M_allocated_capacity = *psVar9;
      local_298.field_2._8_8_ = plVar6[3];
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    }
    else {
      local_298.field_2._M_allocated_capacity = *psVar9;
    }
    local_298._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_2f8._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2f8._M_dataplus._M_p == psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar6[3];
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
    }
    local_2f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_258._M_dataplus._M_p._0_4_ = 0x553;
    StreamableToString<int>(&local_278,(int *)&local_258);
    std::operator+(&local_2d8,&local_2f8,&local_278);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    local_c8.sa_handler = (__sighandler_t)*plVar6;
    p_Var10 = (__sighandler_t)(plVar6 + 2);
    if (local_c8.sa_handler == p_Var10) {
      local_c0.__val[1] = *(ulong *)p_Var10;
      local_c0.__val[2] = plVar6[3];
      local_c8.sa_handler = (__sighandler_t)(local_c0.__val + 1);
    }
    else {
      local_c0.__val[1] = *(ulong *)p_Var10;
    }
    local_c0.__val[0] = plVar6[1];
    *plVar6 = (long)p_Var10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_160.sa_handler = (__sighandler_t)*plVar6;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.sa_handler == paVar14) {
      local_150[0]._0_8_ = paVar14->_M_allocated_capacity;
      local_150[0]._8_8_ = plVar6[3];
      local_160.sa_handler = (__sighandler_t)local_150;
    }
    else {
      local_150[0]._0_8_ = paVar14->_M_allocated_capacity;
    }
    local_158 = plVar6[1];
    *plVar6 = (long)paVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    DeathTestAbort((string *)&local_160);
  }
  paVar14 = &local_298.field_2;
  local_298._M_dataplus._M_p = (pointer)paVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"--","");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_2f8.field_2._M_allocated_capacity = *psVar9;
    local_2f8.field_2._8_8_ = plVar6[3];
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar9;
    local_2f8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_2f8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_2d8.field_2._M_allocated_capacity = *psVar9;
    local_2d8.field_2._8_8_ = plVar6[3];
  }
  else {
    local_2d8.field_2._M_allocated_capacity = *psVar9;
    local_2d8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_2d8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
  _Var2.sa_handler = (__sighandler_t)(local_c0.__val + 1);
  p_Var10 = (__sighandler_t)(puVar7 + 2);
  if ((__sighandler_t)*puVar7 == p_Var10) {
    local_c0.__val[1] = *(ulong *)p_Var10;
    local_c0.__val[2] = puVar7[3];
    local_c8.sa_handler = _Var2.sa_handler;
  }
  else {
    local_c0.__val[1] = *(ulong *)p_Var10;
    local_c8.sa_handler = (__sighandler_t)*puVar7;
  }
  local_c0.__val[0] = puVar7[1];
  *puVar7 = p_Var10;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar11) {
    local_150[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_150[0]._8_8_ = plVar6[3];
    local_160.sa_handler = (__sighandler_t)local_150;
  }
  else {
    local_150[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_160.sa_handler = (__sighandler_t)*plVar6;
  }
  local_158 = plVar6[1];
  *plVar6 = (long)paVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_180.field_2._M_allocated_capacity = *psVar9;
    local_180.field_2._8_8_ = plVar6[3];
  }
  else {
    local_180.field_2._M_allocated_capacity = *psVar9;
    local_180._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_180._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.sa_handler != local_150) {
    operator_delete(local_160.sa_handler,local_150[0]._M_allocated_capacity + 1);
  }
  if (local_c8.sa_handler != _Var2.sa_handler) {
    operator_delete(local_c8.sa_handler,local_c0.__val[1] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar14) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"--","");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_238);
  paVar11 = &local_258.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_258.field_2._M_allocated_capacity = *psVar9;
    local_258.field_2._8_8_ = plVar6[3];
    local_258._M_dataplus._M_p = (pointer)paVar11;
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar9;
    local_258._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_258._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_278.field_2._M_allocated_capacity = *psVar9;
    local_278.field_2._8_8_ = plVar6[3];
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *psVar9;
    local_278._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_278._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_2b8.field_2._M_allocated_capacity = *psVar9;
    local_2b8.field_2._8_8_ = plVar6[3];
  }
  else {
    local_2b8.field_2._M_allocated_capacity = *psVar9;
    local_2b8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_2b8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  puVar12 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_298.field_2._M_allocated_capacity = *puVar12;
    local_298.field_2._8_8_ = plVar6[3];
    local_298._M_dataplus._M_p = (pointer)paVar14;
  }
  else {
    local_298.field_2._M_allocated_capacity = *puVar12;
    local_298._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_298._M_string_length = plVar6[1];
  *plVar6 = (long)puVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  StreamableToString<int>(&local_218,&this->line_);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar14) {
    uVar16 = local_298.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_218._M_string_length + local_298._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_218._M_dataplus._M_p._4_4_,local_218._M_dataplus._M_p._0_4_) !=
        &local_218.field_2) {
      uVar16 = local_218.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_218._M_string_length + local_298._M_string_length) goto LAB_0010b514;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_218,0,(char *)0x0,(ulong)local_298._M_dataplus._M_p);
  }
  else {
LAB_0010b514:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_298,
                        (ulong)CONCAT44(local_218._M_dataplus._M_p._4_4_,
                                        local_218._M_dataplus._M_p._0_4_));
  }
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  psVar9 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_2f8.field_2._M_allocated_capacity = *psVar9;
    local_2f8.field_2._8_8_ = puVar7[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar9;
    local_2f8._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_2f8._M_string_length = puVar7[1];
  *puVar7 = psVar9;
  puVar7[1] = 0;
  *(undefined1 *)psVar9 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  puVar12 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_2d8.field_2._M_allocated_capacity = *puVar12;
    local_2d8.field_2._8_8_ = plVar6[3];
  }
  else {
    local_2d8.field_2._M_allocated_capacity = *puVar12;
    local_2d8._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_2d8._M_string_length = plVar6[1];
  *plVar6 = (long)puVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  StreamableToString<int>(&local_1e8,local_1c8);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    uVar16 = local_2d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_1e8._M_string_length + local_2d8._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      uVar16 = local_1e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_1e8._M_string_length + local_2d8._M_string_length) goto LAB_0010b637;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_1e8,0,(char *)0x0,(ulong)local_2d8._M_dataplus._M_p);
  }
  else {
LAB_0010b637:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_1e8._M_dataplus._M_p);
  }
  p_Var10 = (__sighandler_t)(puVar7 + 2);
  if ((__sighandler_t)*puVar7 == p_Var10) {
    local_c0.__val[1] = *(ulong *)p_Var10;
    local_c0.__val[2] = puVar7[3];
    local_c8.sa_handler = _Var2.sa_handler;
  }
  else {
    local_c0.__val[1] = *(ulong *)p_Var10;
    local_c8.sa_handler = (__sighandler_t)*puVar7;
  }
  local_c0.__val[0] = puVar7[1];
  *puVar7 = p_Var10;
  puVar7[1] = 0;
  *p_Var10 = (__sighandler_t)0x0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar13) {
    local_150[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_150[0]._8_8_ = plVar6[3];
    local_160.sa_handler = (__sighandler_t)local_150;
  }
  else {
    local_150[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_160.sa_handler = (__sighandler_t)*plVar6;
  }
  local_158 = plVar6[1];
  *plVar6 = (long)paVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  StreamableToString<int>(&local_1c0,&local_1f4);
  uVar1 = CONCAT44(local_1c0._M_string_length._4_4_,(int)local_1c0._M_string_length) + local_158;
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.sa_handler != local_150) {
    uVar16 = local_150[0]._M_allocated_capacity;
  }
  if ((ulong)uVar16 < uVar1) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      uVar16 = local_1c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < uVar1) goto LAB_0010b777;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,(ulong)local_160);
  }
  else {
LAB_0010b777:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_1c0._M_dataplus._M_p);
  }
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  psVar9 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_1a0.field_2._M_allocated_capacity = *psVar9;
    local_1a0.field_2._8_8_ = puVar7[3];
  }
  else {
    local_1a0.field_2._M_allocated_capacity = *psVar9;
    local_1a0._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_1a0._M_string_length = puVar7[1];
  *puVar7 = psVar9;
  puVar7[1] = 0;
  *(undefined1 *)psVar9 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.sa_handler != local_150) {
    operator_delete(local_160.sa_handler,local_150[0]._M_allocated_capacity + 1);
  }
  if (local_c8.sa_handler != _Var2.sa_handler) {
    operator_delete(local_c8.sa_handler,local_c0.__val[1] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_218._M_dataplus._M_p._4_4_,local_218._M_dataplus._M_p._0_4_) !=
      &local_218.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_218._M_dataplus._M_p._4_4_,local_218._M_dataplus._M_p._0_4_),
                    local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar14) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar11) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&g_argvs_abi_cxx11_;
  if (g_injected_test_argvs_abi_cxx11_ !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    __x = g_injected_test_argvs_abi_cxx11_;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_1e8,__x);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1e8,&local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1e8,&local_1a0);
  local_160.sa_handler = (__sighandler_t)local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.sa_handler != local_150) {
    operator_delete(local_160.sa_handler,local_150[0]._M_allocated_capacity + 1);
  }
  CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
  fflush((FILE *)0x0);
  CreateArgvFromArgs((internal *)&local_1f0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_1e8);
  local_1c0._M_dataplus._M_p = local_1f0;
  local_1c0._M_string_length._0_4_ = local_1f8;
  memset(&local_c8,0,0x98);
  sigemptyset(&local_c0);
  local_c8 = (_union_1457)0x1;
  while (iVar4 = sigaction(0x1b,(sigaction *)&local_c8,(sigaction *)&local_160), iVar4 == -1) {
    piVar8 = __errno_location();
    if (*piVar8 != 4) {
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"CHECK failed: File ","")
      ;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_258._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_258._M_dataplus._M_p == psVar9) {
        local_258.field_2._M_allocated_capacity = *psVar9;
        local_258.field_2._8_8_ = plVar6[3];
        local_258._M_dataplus._M_p = (pointer)paVar11;
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar9;
      }
      local_258._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
      local_278._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_278._M_dataplus._M_p == psVar9) {
        local_278.field_2._M_allocated_capacity = *psVar9;
        local_278.field_2._8_8_ = plVar6[3];
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      else {
        local_278.field_2._M_allocated_capacity = *psVar9;
      }
      local_278._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_1c8[1] = 0x50e;
      StreamableToString<int>(&local_218,local_1c8 + 1);
      std::operator+(&local_2b8,&local_278,&local_218);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_298._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_298._M_dataplus._M_p == psVar9) {
        local_298.field_2._M_allocated_capacity = *psVar9;
        local_298.field_2._8_8_ = plVar6[3];
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      }
      else {
        local_298.field_2._M_allocated_capacity = *psVar9;
      }
      local_298._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_2f8._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_2f8._M_dataplus._M_p == psVar9) {
        local_2f8.field_2._M_allocated_capacity = *psVar9;
        local_2f8.field_2._8_8_ = plVar6[3];
        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      }
      else {
        local_2f8.field_2._M_allocated_capacity = *psVar9;
      }
      local_2f8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2d8._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_2d8._M_dataplus._M_p == psVar9) {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8.field_2._8_8_ = plVar6[3];
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
      }
      local_2d8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      DeathTestAbort(&local_2d8);
    }
  }
  if (FLAGS_gtest_death_test_use_fork == '\0') {
    if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') goto LAB_0010c1a5;
  }
  else {
    iVar4 = fork();
    if (iVar4 != 0) goto LAB_0010bbac;
    ExecDeathTestChildMain(&local_1c0);
LAB_0010c1a5:
    AssumeRole();
  }
  iVar4 = getpagesize();
  __len = (size_t)(iVar4 * 2);
  __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
  if (__addr == (void *)0xffffffffffffffff) {
    local_258._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CHECK failed: File ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
    local_278._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_278._M_dataplus._M_p == psVar9) {
      local_278.field_2._M_allocated_capacity = *psVar9;
      local_278.field_2._8_8_ = plVar6[3];
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    }
    else {
      local_278.field_2._M_allocated_capacity = *psVar9;
    }
    local_278._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    local_2b8._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2b8._M_dataplus._M_p == psVar9) {
      local_2b8.field_2._M_allocated_capacity = *psVar9;
      local_2b8.field_2._8_8_ = plVar6[3];
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    }
    else {
      local_2b8.field_2._M_allocated_capacity = *psVar9;
    }
    local_2b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_218._M_dataplus._M_p._0_4_ = 0x51a;
    StreamableToString<int>(&local_238,(int *)&local_218);
    std::operator+(&local_298,&local_2b8,&local_238);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_2f8._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2f8._M_dataplus._M_p == psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar6[3];
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
    }
    local_2f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f8);
    local_2d8._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2d8._M_dataplus._M_p == psVar9) {
      local_2d8.field_2._M_allocated_capacity = *psVar9;
      local_2d8.field_2._8_8_ = plVar6[3];
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    }
    else {
      local_2d8.field_2._M_allocated_capacity = *psVar9;
    }
    local_2d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    DeathTestAbort(&local_2d8);
  }
  lVar15 = 0;
  if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
    lVar15 = __len - 0x40;
  }
  if (((uint)(iVar4 * 2) < 0x41) || (((ulong)(lVar15 + (long)__addr) & 0x3f) != 0)) {
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CHECK failed: File ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
    local_278._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_278._M_dataplus._M_p == psVar9) {
      local_278.field_2._M_allocated_capacity = *psVar9;
      local_278.field_2._8_8_ = plVar6[3];
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    }
    else {
      local_278.field_2._M_allocated_capacity = *psVar9;
    }
    local_278._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    local_2b8._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2b8._M_dataplus._M_p == psVar9) {
      local_2b8.field_2._M_allocated_capacity = *psVar9;
      local_2b8.field_2._8_8_ = plVar6[3];
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    }
    else {
      local_2b8.field_2._M_allocated_capacity = *psVar9;
    }
    local_2b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_218._M_dataplus._M_p._0_4_ = 0x528;
    StreamableToString<int>(&local_238,(int *)&local_218);
    std::operator+(&local_298,&local_2b8,&local_238);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_2f8._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2f8._M_dataplus._M_p == psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar6[3];
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
    }
    local_2f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f8);
    local_2d8._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2d8._M_dataplus._M_p == psVar9) {
      local_2d8.field_2._M_allocated_capacity = *psVar9;
      local_2d8.field_2._8_8_ = plVar6[3];
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    }
    else {
      local_2d8.field_2._M_allocated_capacity = *psVar9;
    }
    local_2d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    DeathTestAbort(&local_2d8);
  }
  iVar4 = clone(ExecDeathTestChildMain,(void *)(lVar15 + (long)__addr),0x11,&local_1c0);
  iVar5 = munmap(__addr,__len);
  if (iVar5 == -1) {
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CHECK failed: File ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
    local_278._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_278._M_dataplus._M_p == psVar9) {
      local_278.field_2._M_allocated_capacity = *psVar9;
      local_278.field_2._8_8_ = plVar6[3];
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    }
    else {
      local_278.field_2._M_allocated_capacity = *psVar9;
    }
    local_278._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    local_2b8._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2b8._M_dataplus._M_p == psVar9) {
      local_2b8.field_2._M_allocated_capacity = *psVar9;
      local_2b8.field_2._8_8_ = plVar6[3];
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    }
    else {
      local_2b8.field_2._M_allocated_capacity = *psVar9;
    }
    local_2b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_218._M_dataplus._M_p._0_4_ = 0x52c;
    StreamableToString<int>(&local_238,(int *)&local_218);
    std::operator+(&local_298,&local_2b8,&local_238);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_2f8._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2f8._M_dataplus._M_p == psVar9) {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
      local_2f8.field_2._8_8_ = plVar6[3];
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar9;
    }
    local_2f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f8);
    local_2d8._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2d8._M_dataplus._M_p == psVar9) {
      local_2d8.field_2._M_allocated_capacity = *psVar9;
      local_2d8.field_2._8_8_ = plVar6[3];
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    }
    else {
      local_2d8.field_2._M_allocated_capacity = *psVar9;
    }
    local_2d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    DeathTestAbort(&local_2d8);
  }
LAB_0010bbac:
  while (iVar5 = sigaction(0x1b,(sigaction *)&local_160,(sigaction *)0x0), iVar5 == -1) {
    piVar8 = __errno_location();
    if (*piVar8 != 4) {
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"CHECK failed: File ","")
      ;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_258._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_258._M_dataplus._M_p == psVar9) {
        local_258.field_2._M_allocated_capacity = *psVar9;
        local_258.field_2._8_8_ = plVar6[3];
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar9;
      }
      local_258._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
      local_278._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_278._M_dataplus._M_p == psVar9) {
        local_278.field_2._M_allocated_capacity = *psVar9;
        local_278.field_2._8_8_ = plVar6[3];
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      else {
        local_278.field_2._M_allocated_capacity = *psVar9;
      }
      local_278._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_1c8[1] = 0x538;
      StreamableToString<int>(&local_218,local_1c8 + 1);
      std::operator+(&local_2b8,&local_278,&local_218);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_298._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_298._M_dataplus._M_p == psVar9) {
        local_298.field_2._M_allocated_capacity = *psVar9;
        local_298.field_2._8_8_ = plVar6[3];
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      }
      else {
        local_298.field_2._M_allocated_capacity = *psVar9;
      }
      local_298._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_2f8._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_2f8._M_dataplus._M_p == psVar9) {
        local_2f8.field_2._M_allocated_capacity = *psVar9;
        local_2f8.field_2._8_8_ = plVar6[3];
        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      }
      else {
        local_2f8.field_2._M_allocated_capacity = *psVar9;
      }
      local_2f8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2d8._M_dataplus._M_p = (pointer)*plVar6;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_2d8._M_dataplus._M_p == psVar9) {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8.field_2._8_8_ = plVar6[3];
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
      }
      local_2d8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      DeathTestAbort(&local_2d8);
    }
  }
  if (iVar4 != -1) {
    do {
      iVar5 = close(local_1f4);
      if (iVar5 != -1) {
        *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar4;
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_1f8;
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        if (local_1f0 != (pointer)0x0) {
          operator_delete__(local_1f0);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        return OVERSEE_TEST;
      }
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"CHECK failed: File ","");
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
    local_2b8._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2b8._M_dataplus._M_p == psVar9) {
      local_2b8.field_2._M_allocated_capacity = *psVar9;
      local_2b8.field_2._8_8_ = plVar6[3];
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    }
    else {
      local_2b8.field_2._M_allocated_capacity = *psVar9;
    }
    local_2b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_298._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_298._M_dataplus._M_p == psVar9) {
      local_298.field_2._M_allocated_capacity = *psVar9;
      local_298.field_2._8_8_ = plVar6[3];
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    }
    else {
      local_298.field_2._M_allocated_capacity = *psVar9;
    }
    local_298._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_238._M_dataplus._M_p._0_4_ = 0x56a;
    StreamableToString<int>(&local_258,(int *)&local_238);
    std::operator+(&local_2f8,&local_298,&local_258);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f8);
    local_2d8._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_2d8._M_dataplus._M_p == psVar9) {
      local_2d8.field_2._M_allocated_capacity = *psVar9;
      local_2d8.field_2._8_8_ = plVar6[3];
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    }
    else {
      local_2d8.field_2._M_allocated_capacity = *psVar9;
    }
    local_2d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
    local_c8.sa_handler = (__sighandler_t)*puVar7;
    p_Var10 = (__sighandler_t)(puVar7 + 2);
    if (local_c8.sa_handler == p_Var10) {
      local_c0.__val[1] = *(ulong *)p_Var10;
      local_c0.__val[2] = puVar7[3];
      local_c8.sa_handler = _Var2.sa_handler;
    }
    else {
      local_c0.__val[1] = *(ulong *)p_Var10;
    }
    local_c0.__val[0] = puVar7[1];
    *puVar7 = p_Var10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_160.sa_handler = (__sighandler_t)*plVar6;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.sa_handler == paVar14) {
      local_150[0]._0_8_ = paVar14->_M_allocated_capacity;
      local_150[0]._8_8_ = plVar6[3];
      local_160.sa_handler = (__sighandler_t)local_150;
    }
    else {
      local_150[0]._0_8_ = paVar14->_M_allocated_capacity;
    }
    local_158 = plVar6[1];
    *plVar6 = (long)paVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    DeathTestAbort((string *)&local_160);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CHECK failed: File ","");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_278._M_dataplus._M_p = (pointer)*plVar6;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_278._M_dataplus._M_p == psVar9) {
    local_278.field_2._M_allocated_capacity = *psVar9;
    local_278.field_2._8_8_ = plVar6[3];
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *psVar9;
  }
  local_278._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_2b8._M_dataplus._M_p = (pointer)*plVar6;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_2b8._M_dataplus._M_p == psVar9) {
    local_2b8.field_2._M_allocated_capacity = *psVar9;
    local_2b8.field_2._8_8_ = plVar6[3];
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  }
  else {
    local_2b8.field_2._M_allocated_capacity = *psVar9;
  }
  local_2b8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_218._M_dataplus._M_p._0_4_ = 0x53b;
  StreamableToString<int>(&local_238,(int *)&local_218);
  std::operator+(&local_298,&local_2b8,&local_238);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
  local_2f8._M_dataplus._M_p = (pointer)*plVar6;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_2f8._M_dataplus._M_p == psVar9) {
    local_2f8.field_2._M_allocated_capacity = *psVar9;
    local_2f8.field_2._8_8_ = plVar6[3];
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar9;
  }
  local_2f8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  local_2d8._M_dataplus._M_p = (pointer)*plVar6;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_2d8._M_dataplus._M_p == psVar9) {
    local_2d8.field_2._M_allocated_capacity = *psVar9;
    local_2d8.field_2._8_8_ = plVar6[3];
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  }
  else {
    local_2d8.field_2._M_allocated_capacity = *psVar9;
  }
  local_2d8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  DeathTestAbort(&local_2d8);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  "filter=" + info->test_suite_name() + "." +
                                  info->name();
  const std::string internal_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                    "internal_run_death_test=" + file_ + "|" +
                                    StreamableToString(line_) + "|" +
                                    StreamableToString(death_test_index) + "|" +
                                    StreamableToString(pipe_fd[1]);
  std::vector<std::string> args = GetArgvsForDeathTestChildProcess();
  args.push_back(filter_flag);
  args.push_back(internal_flag);

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  std::unique_ptr<char*[]> argv = CreateArgvFromArgs(args);
  const pid_t child_pid = ExecDeathTestSpawnChild(argv.get(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}